

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int yaml_parser_load_sequence(yaml_parser_t *parser,yaml_event_t *first_event)

{
  yaml_node_t *pyVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  yaml_char_t *local_110;
  yaml_char_t *tag;
  int item_index;
  int index;
  anon_struct_24_3_654a3493 items;
  yaml_node_t node;
  yaml_event_t event;
  yaml_event_t *first_event_local;
  yaml_parser_t *parser_local;
  
  memset(&item_index,0,0x18);
  local_110 = (first_event->data).scalar.tag;
  if (((long)(parser->document->nodes).top - (long)(parser->document->nodes).start) / 0x60 <
      0x7ffffffe) {
    if ((local_110 == (yaml_char_t *)0x0) || (iVar3 = strcmp((char *)local_110,"!"), iVar3 == 0)) {
      yaml_free(local_110);
      local_110 = yaml_strdup((yaml_char_t *)"tag:yaml.org,2002:seq");
      if (local_110 == (yaml_char_t *)0x0) goto LAB_00107671;
    }
    _item_index = (yaml_node_item_t *)yaml_malloc(0x40);
    if (_item_index == (yaml_node_item_t *)0x0) {
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      items.start = _item_index + 0x10;
      items.end = _item_index;
      memset(&items.top,0,0x60);
      items.top._0_4_ = 2;
      node._0_8_ = local_110;
      node.data._24_8_ = (first_event->start_mark).index;
      node.start_mark.index = (first_event->start_mark).line;
      node.start_mark.line = (first_event->start_mark).column;
      node.start_mark.column = (first_event->end_mark).index;
      node.end_mark.index = (first_event->end_mark).line;
      node.end_mark.line = (first_event->end_mark).column;
      node.tag = (yaml_char_t *)_item_index;
      node.data.sequence.items.start = items.start;
      node.data.sequence.items.end = _item_index;
      node.data.scalar.style = *(yaml_scalar_style_t *)((long)&first_event->data + 0x14);
      if (((parser->document->nodes).top != (parser->document->nodes).end) ||
         (iVar3 = yaml_stack_extend((void **)parser->document,&(parser->document->nodes).top,
                                    &(parser->document->nodes).end), iVar3 != 0)) {
        pyVar1 = (parser->document->nodes).top;
        (parser->document->nodes).top = pyVar1 + 1;
        memcpy(pyVar1,&items.top,0x60);
        iVar3 = (int)(((long)(parser->document->nodes).top - (long)(parser->document->nodes).start)
                     / 0x60);
        iVar4 = yaml_parser_register_anchor(parser,iVar3,(first_event->data).scalar.anchor);
        if (iVar4 == 0) {
          return 0;
        }
        iVar4 = yaml_parser_parse(parser,(yaml_event_t *)&node.end_mark.column);
        if (iVar4 == 0) {
          return 0;
        }
        while( true ) {
          if ((int)node.end_mark.column == 8) {
            pyVar1 = (parser->document->nodes).start;
            iVar4 = iVar3 + -1;
            pyVar1[iVar4].end_mark.index = event.start_mark.column;
            pyVar1[iVar4].end_mark.line = event.end_mark.index;
            pyVar1[iVar4].end_mark.column = event.end_mark.line;
            return iVar3;
          }
          if (0x7ffffffd <
              (long)(parser->document->nodes).start[iVar3 + -1].data.sequence.items.top -
              (long)(parser->document->nodes).start[iVar3 + -1].data.scalar.value >> 2) {
            parser->error = YAML_MEMORY_ERROR;
            return 0;
          }
          iVar4 = yaml_parser_load_node(parser,(yaml_event_t *)&node.end_mark.column);
          if (iVar4 == 0) {
            return 0;
          }
          if (((parser->document->nodes).start[iVar3 + -1].data.sequence.items.top ==
               (yaml_node_item_t *)(parser->document->nodes).start[iVar3 + -1].data.scalar.length)
             && (iVar5 = yaml_stack_extend((void **)&(parser->document->nodes).start[iVar3 + -1].
                                                     data,
                                           (void **)((long)&(parser->document->nodes).start
                                                            [iVar3 + -1].data + 0x10),
                                           (void **)&(parser->document->nodes).start[iVar3 + -1].
                                                     data.scalar.length), iVar5 == 0)) break;
          pyVar1 = (parser->document->nodes).start;
          piVar2 = pyVar1[iVar3 + -1].data.sequence.items.top;
          pyVar1[iVar3 + -1].data.sequence.items.top = piVar2 + 1;
          *piVar2 = iVar4;
          iVar4 = yaml_parser_parse(parser,(yaml_event_t *)&node.end_mark.column);
          if (iVar4 == 0) {
            return 0;
          }
        }
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      parser->error = YAML_MEMORY_ERROR;
    }
  }
  else {
    parser->error = YAML_MEMORY_ERROR;
  }
LAB_00107671:
  yaml_free(local_110);
  yaml_free((first_event->data).document_start.version_directive);
  return 0;
}

Assistant:

static int
yaml_parser_load_sequence(yaml_parser_t *parser, yaml_event_t *first_event)
{
    yaml_event_t event;
    yaml_node_t node;
    struct {
        yaml_node_item_t *start;
        yaml_node_item_t *end;
        yaml_node_item_t *top;
    } items = { NULL, NULL, NULL };
    int index, item_index;
    yaml_char_t *tag = first_event->data.sequence_start.tag;

    if (!STACK_LIMIT(parser, parser->document->nodes, INT_MAX-1)) goto error;

    if (!tag || strcmp((char *)tag, "!") == 0) {
        yaml_free(tag);
        tag = yaml_strdup((yaml_char_t *)YAML_DEFAULT_SEQUENCE_TAG);
        if (!tag) goto error;
    }

    if (!STACK_INIT(parser, items, yaml_node_item_t*)) goto error;

    SEQUENCE_NODE_INIT(node, tag, items.start, items.end,
            first_event->data.sequence_start.style,
            first_event->start_mark, first_event->end_mark);

    if (!PUSH(parser, parser->document->nodes, node)) goto error;

    index = parser->document->nodes.top - parser->document->nodes.start;

    if (!yaml_parser_register_anchor(parser, index,
                first_event->data.sequence_start.anchor)) return 0;

    if (!yaml_parser_parse(parser, &event)) return 0;

    while (event.type != YAML_SEQUENCE_END_EVENT) {
        if (!STACK_LIMIT(parser,
                    parser->document->nodes.start[index-1].data.sequence.items,
                    INT_MAX-1)) return 0;
        item_index = yaml_parser_load_node(parser, &event);
        if (!item_index) return 0;
        if (!PUSH(parser,
                    parser->document->nodes.start[index-1].data.sequence.items,
                    item_index)) return 0;
        if (!yaml_parser_parse(parser, &event)) return 0;
    }

    parser->document->nodes.start[index-1].end_mark = event.end_mark;

    return index;

error:
    yaml_free(tag);
    yaml_free(first_event->data.sequence_start.anchor);
    return 0;
}